

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

ImGuiSortDirection ImGui::TableGetColumnNextSortDirection(ImGuiTableColumn *column)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  byte bVar4;
  
  bVar1 = column->field_0x64;
  if ((bVar1 & 0xc) == 0) {
    __assert_fail("column->SortDirectionsAvailCount > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O3/_deps/imgui-src/imgui_tables.cpp"
                  ,0x9e4,
                  "ImGuiSortDirection ImGui::TableGetColumnNextSortDirection(ImGuiTableColumn *)");
  }
  if (column->SortOrder == -1) {
    bVar1 = column->SortDirectionsAvailList;
  }
  else {
    uVar3 = bVar1 >> 2 & 3;
    bVar4 = 1;
    iVar2 = 0;
    while( true ) {
      if (uVar3 * 2 == iVar2) {
        __assert_fail("n < column->SortDirectionsAvailCount",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O3/_deps/imgui-src/imgui_tables.cpp"
                      ,0x9d1,
                      "ImGuiSortDirection TableGetColumnAvailSortDirection(ImGuiTableColumn *, int)"
                     );
      }
      if ((column->SortDirectionsAvailList >> ((byte)iVar2 & 0x1f) & 3) == (bVar1 & 3)) break;
      bVar4 = bVar4 + 1;
      iVar2 = iVar2 + 2;
      if (iVar2 == 6) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O3/_deps/imgui-src/imgui_tables.cpp"
                      ,0x9ea,
                      "ImGuiSortDirection ImGui::TableGetColumnNextSortDirection(ImGuiTableColumn *)"
                     );
      }
    }
    bVar1 = column->SortDirectionsAvailList >> (bVar4 % (byte)uVar3) * '\x02';
  }
  return bVar1 & 3;
}

Assistant:

ImGuiSortDirection ImGui::TableGetColumnNextSortDirection(ImGuiTableColumn* column)
{
    IM_ASSERT(column->SortDirectionsAvailCount > 0);
    if (column->SortOrder == -1)
        return TableGetColumnAvailSortDirection(column, 0);
    for (int n = 0; n < 3; n++)
        if (column->SortDirection == TableGetColumnAvailSortDirection(column, n))
            return TableGetColumnAvailSortDirection(column, (n + 1) % column->SortDirectionsAvailCount);
    IM_ASSERT(0);
    return ImGuiSortDirection_None;
}